

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPServer.cpp
# Opt level: O2

void __thiscall SocketPP::TCPServer::~TCPServer(TCPServer *this)

{
  thread *this_00;
  
  (this->super_SocketServer).super_Socket._vptr_Socket = (_func_int **)&PTR_onConnected_0010bcd0;
  (this->super_SocketServer).super_Socket.field_0xd = 1;
  std::condition_variable::notify_one();
  std::thread::join();
  this_00 = this->sendThread_;
  if (this_00 != (thread *)0x0) {
    std::thread::~thread(this_00);
  }
  operator_delete(this_00);
  std::_Function_base::~_Function_base(&(this->discHandle_).super__Function_base);
  std::_Function_base::~_Function_base(&(this->connHandle_).super__Function_base);
  std::_Function_base::~_Function_base(&(this->recvHandle_).super__Function_base);
  std::_Function_base::~_Function_base(&(this->sendHandle_).super__Function_base);
  std::_Function_base::~_Function_base(&(this->sendInterceptor_).super__Function_base);
  std::condition_variable::~condition_variable(&this->msgQueueCondition_);
  std::deque<SocketPP::Message,_std::allocator<SocketPP::Message>_>::~deque(&(this->msgQueue_).c);
  std::_Vector_base<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>::~_Vector_base
            (&(this->connectedStreams_).
              super__Vector_base<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>);
  Socket::~Socket((Socket *)this);
  return;
}

Assistant:

TCPServer::~TCPServer() {
    stopped_ = true;
    msgQueueCondition_.notify_one();
    sendThread_->join();
    delete sendThread_;
}